

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Parsing.c
# Opt level: O3

void JsonLibTests_Parsing_Register(void)

{
  WjTestLib_NewGroup("Parsing");
  WjTestLib_AddTest(TestStrings_Json1,"Strings (Json1)");
  WjTestLib_AddTest(TestStrings_Json5,"Strings (Json5)");
  WjTestLib_AddTest(TestNumbers_Json1,"Numbers (Json1)");
  WjTestLib_AddTest(TestNumbers_Json5,"Numbers (Json5)");
  WjTestLib_AddTest(TestBools_Json1,"Bools (Json1)");
  WjTestLib_AddTest(TestBools_Json5,"Bools (Json5)");
  WjTestLib_AddTest(TestLists_Json1,"Lists (Json1)");
  WjTestLib_AddTest(TestLists_Json5,"Lists (Json5)");
  WjTestLib_AddTest(TestDictionaries_Json1,"Dictionaries (Json1)");
  WjTestLib_AddTest(TestDictionaries_Json5,"Dictionaries (Json5)");
  WjTestLib_AddTest(TestInvalidValues_Json1,"Invalid values (Json1)");
  WjTestLib_AddTest(TestInvalidValues_Json5,"Invalid values (Json5)");
  WjTestLib_AddTest(TestNestedTooDeep,"Nested depth limit");
  WjTestLib_AddTest(TestWhiteSpace_Json1,"White Space (Json1)");
  WjTestLib_AddTest(TestWhiteSpace_Json5,"White Space (Json5)");
  WjTestLib_AddTest(TestComments,"Comments (Json5)");
  return;
}

Assistant:

void
    JsonLibTests_Parsing_Register
    (
        void
    )
{
    WjTestLib_NewGroup( "Parsing" );
    WjTestLib_AddTest( TestStrings_Json1, "Strings (Json1)" );
    WjTestLib_AddTest( TestStrings_Json5, "Strings (Json5)" );
    WjTestLib_AddTest( TestNumbers_Json1, "Numbers (Json1)" );
    WjTestLib_AddTest( TestNumbers_Json5, "Numbers (Json5)" );
    WjTestLib_AddTest( TestBools_Json1, "Bools (Json1)" );
    WjTestLib_AddTest( TestBools_Json5, "Bools (Json5)" );
    WjTestLib_AddTest( TestLists_Json1, "Lists (Json1)" );
    WjTestLib_AddTest( TestLists_Json5, "Lists (Json5)" );
    WjTestLib_AddTest( TestDictionaries_Json1, "Dictionaries (Json1)" );
    WjTestLib_AddTest( TestDictionaries_Json5, "Dictionaries (Json5)" );
    WjTestLib_AddTest( TestInvalidValues_Json1, "Invalid values (Json1)" );
    WjTestLib_AddTest( TestInvalidValues_Json5, "Invalid values (Json5)" );
    WjTestLib_AddTest( TestNestedTooDeep, "Nested depth limit" );
    WjTestLib_AddTest( TestWhiteSpace_Json1, "White Space (Json1)" );
    WjTestLib_AddTest( TestWhiteSpace_Json5, "White Space (Json5)" );
    WjTestLib_AddTest( TestComments, "Comments (Json5)" );
}